

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshot.cpp
# Opt level: O0

void __thiscall
TTD::SnapShot::InflateSingleObject
          (SnapShot *this,SnapObject *snpObject,InflateMap *inflator,
          TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapObjects::SnapObject_*> *idToSnpObjectMap
          )

{
  fPtr_DoObjectInflation p_Var1;
  bool bVar2;
  int iVar3;
  SnapObject **ppSVar4;
  ScriptContext *pSVar5;
  RecyclableObject *obj;
  DynamicObject *pDVar6;
  DynamicObject *dynObj;
  char buff [1024];
  fPtr_DoObjectInflation inflateFPtr;
  ScriptContext *ctx;
  RecyclableObject *res;
  SnapObject *depOnObj;
  uint32 i;
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapObjects::SnapObject_*> *idToSnpObjectMap_local;
  InflateMap *inflator_local;
  SnapObject *snpObject_local;
  SnapShot *this_local;
  
  bVar2 = InflateMap::IsObjectAlreadyInflated(inflator,snpObject->ObjectPtrId);
  if (!bVar2) {
    if (snpObject->OptDependsOnInfo != (DependsOnInfo *)0x0) {
      for (depOnObj._4_4_ = 0; depOnObj._4_4_ < snpObject->OptDependsOnInfo->DepOnCount;
          depOnObj._4_4_ = depOnObj._4_4_ + 1) {
        ppSVar4 = TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapObjects::SnapObject_*>::
                  LookupKnownItem(idToSnpObjectMap,
                                  snpObject->OptDependsOnInfo->DepOnPtrArray[depOnObj._4_4_]);
        InflateSingleObject(this,*ppSVar4,inflator,idToSnpObjectMap);
      }
    }
    if (snpObject->OptWellKnownToken == (TTD_WELLKNOWN_TOKEN)0x0) {
      p_Var1 = this->m_snapObjectVTableArray[snpObject->SnapObjectTag].InflationFunc;
      if (p_Var1 == (fPtr_DoObjectInflation)0x0) {
        sprintf_s<1024ul>((char (*) [1024])&dynObj,
                          "We probably forgot to update the vtable with a tag we added.  Tag is [%i].  SnapRuntimeFunctionObject is [%i]"
                          ,(ulong)snpObject->SnapObjectTag,5);
        TTDAbort_unrecoverable_error((char *)&dynObj);
      }
      ctx = (ScriptContext *)(*p_Var1)(snpObject,inflator);
    }
    else {
      pSVar5 = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
      obj = RuntimeContextInfo::LookupKnownObjectFromPath
                      (pSVar5->TTDWellKnownInfo,snpObject->OptWellKnownToken);
      pDVar6 = Js::VarTo<Js::DynamicObject,Js::RecyclableObject>(obj);
      ctx = (ScriptContext *)NSSnapObjects::ObjectPropertyReset_WellKnown(snpObject,pDVar6,inflator)
      ;
      if (ctx == (ScriptContext *)0x0) {
        TTDAbort_unrecoverable_error("Should always produce a result!!!");
      }
    }
    bVar2 = Js::DynamicType::Is(snpObject->SnapType->JsTypeId);
    if (((bVar2) &&
        (pDVar6 = Js::VarTo<Js::DynamicObject,Js::RecyclableObject>((RecyclableObject *)ctx),
        snpObject->IsCrossSite != 0)) &&
       (iVar3 = (*(pDVar6->super_RecyclableObject).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x66])(), iVar3 == 0)) {
      Js::CrossSite::MarshalCrossSite_TTDInflate(pDVar6);
    }
    InflateMap::AddObject(inflator,snpObject->ObjectPtrId,(RecyclableObject *)ctx);
  }
  return;
}

Assistant:

void SnapShot::InflateSingleObject(const NSSnapObjects::SnapObject* snpObject, InflateMap* inflator, const TTDIdentifierDictionary<TTD_PTR_ID, NSSnapObjects::SnapObject*>& idToSnpObjectMap) const
    {
        if(inflator->IsObjectAlreadyInflated(snpObject->ObjectPtrId))
        {
            return;
        }

        if(snpObject->OptDependsOnInfo != nullptr)
        {
            for(uint32 i = 0; i < snpObject->OptDependsOnInfo->DepOnCount; ++i)
            {
                const NSSnapObjects::SnapObject* depOnObj = idToSnpObjectMap.LookupKnownItem(snpObject->OptDependsOnInfo->DepOnPtrArray[i]);

                //This is recursive but should be shallow
                this->InflateSingleObject(depOnObj, inflator, idToSnpObjectMap);
            }
        }

        Js::RecyclableObject* res = nullptr;
        if(snpObject->OptWellKnownToken != TTD_INVALID_WELLKNOWN_TOKEN)
        {
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);
            res = ctx->TTDWellKnownInfo->LookupKnownObjectFromPath(snpObject->OptWellKnownToken);

            //Well known objects may always be dirty (e.g. we are re-using a context) so we always want to clean them
            res = NSSnapObjects::ObjectPropertyReset_WellKnown(snpObject, Js::VarTo<Js::DynamicObject>(res), inflator);
            TTDAssert(res != nullptr, "Should always produce a result!!!");
        }
        else
        {
            //lookup the inflator function for this object and call it
            NSSnapObjects::fPtr_DoObjectInflation inflateFPtr = this->m_snapObjectVTableArray[(uint32)snpObject->SnapObjectTag].InflationFunc;
            if(inflateFPtr == nullptr)
            {
                char buff[1024];
                sprintf_s(buff, "We probably forgot to update the vtable with a tag we added.  Tag is [%i].  SnapRuntimeFunctionObject is [%i]", (uint32)snpObject->SnapObjectTag, TTD::NSSnapObjects::SnapObjectType::SnapRuntimeFunctionObject);
                TTDAssert(inflateFPtr != nullptr, buff);
            }
            res = inflateFPtr(snpObject, inflator);
        }

        if(Js::DynamicType::Is(snpObject->SnapType->JsTypeId))
        {
            //Always ok to be x-site but if snap was x-site then we must be too
            Js::DynamicObject* dynObj = Js::VarTo<Js::DynamicObject>(res);
            if(snpObject->IsCrossSite && !dynObj->IsCrossSiteObject())
            {
                Js::CrossSite::MarshalCrossSite_TTDInflate(dynObj);
            }
        }

        inflator->AddObject(snpObject->ObjectPtrId, res);
    }